

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O2

void aom_comp_mask_pred_avx2
               (uint8_t *comp_pred,uint8_t *pred,int width,int height,uint8_t *ref,int ref_stride,
               uint8_t *mask,int mask_stride,int invert_mask)

{
  undefined1 (*pauVar1) [16];
  __m256i s0;
  __m256i s0_00;
  __m256i s0_01;
  __m256i s1;
  __m256i s1_00;
  __m256i s1_01;
  __m256i a;
  __m256i a_00;
  __m256i a_01;
  uint uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong *puVar6;
  int x;
  long lVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined4 in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  undefined8 uVar20;
  longlong in_stack_ffffffffffffff70;
  longlong lVar21;
  undefined8 in_stack_ffffffffffffff78;
  undefined8 uVar22;
  undefined8 in_stack_ffffffffffffff80;
  undefined8 uVar23;
  undefined1 in_stack_ffffffffffffff88 [16];
  
  iVar9 = ref_stride;
  puVar6 = (ulong *)ref;
  iVar12 = width;
  if (invert_mask == 0) {
    iVar9 = width;
    puVar6 = (ulong *)pred;
    iVar12 = ref_stride;
    pred = ref;
  }
  lVar8 = (long)iVar12;
  lVar10 = (long)iVar9;
  lVar11 = (long)mask_stride;
  if (width == 8) {
    lVar3 = 0;
    auVar15[8] = 0x40;
    auVar15._0_8_ = 0x4040404040404040;
    auVar15[9] = 0x40;
    auVar15[10] = 0x40;
    auVar15[0xb] = 0x40;
    auVar15[0xc] = 0x40;
    auVar15[0xd] = 0x40;
    auVar15[0xe] = 0x40;
    auVar15[0xf] = 0x40;
    auVar13._8_2_ = 0x200;
    auVar13._0_8_ = 0x200020002000200;
    auVar13._10_2_ = 0x200;
    auVar13._12_2_ = 0x200;
    auVar13._14_2_ = 0x200;
    do {
      auVar14._8_8_ = 0;
      auVar14._0_8_ = *(ulong *)pred;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = *puVar6;
      auVar16 = vpunpcklbw_avx(auVar14,auVar16);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = *(ulong *)mask;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = *(ulong *)((long)pred + lVar8);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = *(ulong *)((long)puVar6 + lVar10);
      auVar19 = vpunpcklbw_avx(auVar18,auVar19);
      auVar14 = vmovhps_avx(auVar17,*(undefined8 *)((long)mask + lVar11));
      auVar18 = vpsubb_avx(auVar15,auVar14);
      auVar17 = vpunpcklbw_avx(auVar17,auVar18);
      auVar16 = vpmaddubsw_avx(auVar16,auVar17);
      auVar14 = vpunpckhbw_avx(auVar14,auVar18);
      auVar14 = vpmaddubsw_avx(auVar19,auVar14);
      auVar16 = vpmulhrsw_avx(auVar16,auVar13);
      auVar14 = vpmulhrsw_avx(auVar14,auVar13);
      auVar14 = vpackuswb_avx(auVar16,auVar14);
      *(undefined1 (*) [16])(comp_pred + lVar3 * 8) = auVar14;
      pred = (uint8_t *)((long)pred + (long)(iVar12 * 2));
      puVar6 = (ulong *)((long)puVar6 + (long)(iVar9 * 2));
      mask = (uint8_t *)((long)mask + (long)(mask_stride * 2));
      lVar3 = lVar3 + 2;
    } while ((int)lVar3 < height);
  }
  else if (width == 0x10) {
    lVar3 = (long)(iVar12 * 2);
    lVar4 = (long)(iVar9 * 2);
    lVar7 = (long)(mask_stride * 2);
    iVar12 = 0;
    do {
      uVar20 = *(undefined8 *)((long)pred + lVar3);
      lVar21 = ((undefined8 *)((long)pred + lVar3))[1];
      pauVar1 = (undefined1 (*) [16])((long)pred + lVar8 + lVar3);
      uVar22 = *(undefined8 *)*pauVar1;
      uVar23 = *(undefined8 *)(*pauVar1 + 8);
      auVar15 = ZEXT116(0) * *(undefined1 (*) [16])(mask + lVar11 + lVar7) +
                ZEXT116(1) * *(undefined1 (*) [16])(mask + lVar7);
      pred = (uint8_t *)((long)pred + lVar3 * 2);
      mask = mask + lVar7 * 2;
      s0[0]._4_4_ = height;
      s0[0]._0_4_ = in_stack_ffffffffffffff38;
      s0[1] = lVar11;
      s0[2] = lVar10;
      s0[3] = lVar8;
      s1[1] = lVar3;
      s1[0] = lVar4;
      s1[2] = uVar20;
      s1[3] = lVar21;
      a._16_16_ = auVar15;
      a._0_16_ = *pauVar1;
      comp_mask_pred_line_avx2(s0,s1,a,comp_pred);
      s0_00[0]._4_4_ = height;
      s0_00[0]._0_4_ = in_stack_ffffffffffffff38;
      s0_00[1] = lVar11;
      s0_00[2] = lVar10;
      s0_00[3] = lVar8;
      s1_00[1] = lVar3;
      s1_00[0] = lVar4;
      s1_00[2] = uVar20;
      s1_00[3] = lVar21;
      a_00[1] = uVar23;
      a_00[0] = uVar22;
      a_00[2] = auVar15._0_8_;
      a_00[3] = auVar15._8_8_;
      comp_mask_pred_line_avx2(s0_00,s1_00,a_00,comp_pred + 0x20);
      comp_pred = comp_pred + 0x40;
      iVar12 = iVar12 + 4;
    } while (iVar12 < height);
  }
  else {
    uVar5 = 0;
    do {
      for (lVar3 = 0; lVar3 < width; lVar3 = lVar3 + 0x20) {
        vlddqu_avx(*(undefined1 (*) [32])((long)pred + lVar3));
        vlddqu_avx(*(undefined1 (*) [32])((long)puVar6 + lVar3));
        vlddqu_avx(*(undefined1 (*) [32])(mask + lVar3));
        s0_01[0]._4_4_ = height;
        s0_01[0]._0_4_ = in_stack_ffffffffffffff38;
        s0_01[1] = lVar11;
        s0_01[2] = lVar10;
        s0_01[3] = lVar8;
        s1_01[1] = in_stack_ffffffffffffff60;
        s1_01[0] = in_stack_ffffffffffffff58;
        s1_01[2] = uVar5;
        s1_01[3] = in_stack_ffffffffffffff70;
        a_01[1] = in_stack_ffffffffffffff80;
        a_01[0] = in_stack_ffffffffffffff78;
        a_01[2] = in_stack_ffffffffffffff88._0_8_;
        a_01[3] = in_stack_ffffffffffffff88._8_8_;
        comp_mask_pred_line_avx2(s0_01,s1_01,a_01,comp_pred + lVar3);
      }
      pred = (uint8_t *)((long)pred + lVar8);
      puVar6 = (ulong *)((long)puVar6 + lVar10);
      mask = mask + lVar11;
      uVar2 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar2;
      comp_pred = comp_pred + lVar3;
    } while ((int)uVar2 < height);
  }
  return;
}

Assistant:

void aom_comp_mask_pred_avx2(uint8_t *comp_pred, const uint8_t *pred, int width,
                             int height, const uint8_t *ref, int ref_stride,
                             const uint8_t *mask, int mask_stride,
                             int invert_mask) {
  int i = 0;
  const uint8_t *src0 = invert_mask ? pred : ref;
  const uint8_t *src1 = invert_mask ? ref : pred;
  const int stride0 = invert_mask ? width : ref_stride;
  const int stride1 = invert_mask ? ref_stride : width;
  if (width == 8) {
    comp_mask_pred_8_ssse3(comp_pred, height, src0, stride0, src1, stride1,
                           mask, mask_stride);
  } else if (width == 16) {
    do {
      const __m256i sA0 = mm256_loadu2(src0 + stride0, src0);
      const __m256i sA1 = mm256_loadu2(src1 + stride1, src1);
      const __m256i aA = mm256_loadu2(mask + mask_stride, mask);
      src0 += (stride0 << 1);
      src1 += (stride1 << 1);
      mask += (mask_stride << 1);
      const __m256i sB0 = mm256_loadu2(src0 + stride0, src0);
      const __m256i sB1 = mm256_loadu2(src1 + stride1, src1);
      const __m256i aB = mm256_loadu2(mask + mask_stride, mask);
      src0 += (stride0 << 1);
      src1 += (stride1 << 1);
      mask += (mask_stride << 1);
      // comp_pred's stride == width == 16
      comp_mask_pred_line_avx2(sA0, sA1, aA, comp_pred);
      comp_mask_pred_line_avx2(sB0, sB1, aB, comp_pred + 32);
      comp_pred += (16 << 2);
      i += 4;
    } while (i < height);
  } else {
    do {
      for (int x = 0; x < width; x += 32) {
        const __m256i sA0 = _mm256_lddqu_si256((const __m256i *)(src0 + x));
        const __m256i sA1 = _mm256_lddqu_si256((const __m256i *)(src1 + x));
        const __m256i aA = _mm256_lddqu_si256((const __m256i *)(mask + x));

        comp_mask_pred_line_avx2(sA0, sA1, aA, comp_pred);
        comp_pred += 32;
      }
      src0 += stride0;
      src1 += stride1;
      mask += mask_stride;
      i++;
    } while (i < height);
  }
}